

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

UBool __thiscall
icu_63::number::FormattedNumber::nextFieldPosition
          (FormattedNumber *this,FieldPosition *fieldPosition,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  FieldPosition *fieldPosition_local;
  FormattedNumber *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fResults == (UFormattedNumberData *)0x0) {
      *status = this->fErrorCode;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ =
           impl::NumberStringBuilder::nextFieldPosition
                     (&this->fResults->string,fieldPosition,status);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

UBool FormattedNumber::nextFieldPosition(FieldPosition& fieldPosition, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return FALSE;
    }
    if (fResults == nullptr) {
        status = fErrorCode;
        return FALSE;
    }
    // NOTE: MSVC sometimes complains when implicitly converting between bool and UBool
    return fResults->string.nextFieldPosition(fieldPosition, status) ? TRUE : FALSE;
}